

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

uint borg_guess_race(uint8_t a,wchar_t c,_Bool multi,wchar_t y,wchar_t x)

{
  chunk_conflict *c_00;
  loc_conflict grid;
  monster *pmVar1;
  monster_conflict *m_ptr;
  wchar_t x_local;
  wchar_t y_local;
  _Bool multi_local;
  wchar_t c_local;
  uint8_t a_local;
  
  c_00 = cave;
  grid = (loc_conflict)loc(x,y);
  pmVar1 = square_monster((chunk *)c_00,grid);
  if (pmVar1 == (monster *)0x0) {
    c_local = L'\0';
  }
  else {
    c_local = pmVar1->race->ridx;
  }
  return c_local;
}

Assistant:

static unsigned int borg_guess_race(
    uint8_t a, wchar_t c, bool multi, int y, int x)
{
    /*  ok, this is an real cheat.  he ought to use the look command
     * in order to correctly id the monster.  but i am passing that up for
     * the sake of speed
     */
    struct monster *m_ptr;
    m_ptr = square_monster(cave, loc(x, y));

    if (!m_ptr)
        return 0;

    /* Actual monsters */
    return (m_ptr->race->ridx);
}